

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>
               (void)

{
  uint *__args_2;
  pointer ppVar1;
  _Base_ptr p_Var2;
  undefined8 uVar3;
  bool bVar4;
  _Rb_tree_node_base *p_Var5;
  undefined1 *puVar6;
  uint rowIndex;
  pointer __args;
  witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>_>
  *witness;
  undefined4 local_640 [2];
  undefined8 local_638;
  shared_count sStack_630;
  undefined8 local_628;
  uint local_620 [2];
  undefined8 *local_618;
  char **local_610;
  char *local_608;
  char *local_600;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>
  m;
  
  build_longer_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>
  ::
  Matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>
              *)&m,&columns,5);
  ppVar1 = columns.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (columns.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[5].
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
    columns.
    super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
  }
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>
            (&columns,&m);
  bars2._M_t._M_impl._0_8_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  build_longer_reduced_row_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>>
            ();
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::_M_move_assign((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                    *)&bars2,
                   (_Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    *)&bars1);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&bars1);
  uVar3 = bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  rowIndex = 0;
  for (witness = (witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>_>
                  *)bars2._M_t._M_impl._0_8_;
      witness !=
      (witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>_>
       *)uVar3; witness = witness + 1) {
    get_ordered_row<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>
              ((column_content<typename_Matrix<RU_rep_options_with_row_access<false,_(Column_types)7,_false,_false,_true,_true,_false,_true>_>::Column>
                *)&bars1,&m,rowIndex);
    test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>>
              (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>_>
                        *)&bars1);
    std::
    _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::~_Rb_tree((_Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *)&bars1);
    rowIndex = rowIndex + 1;
  }
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&bars2);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars1._M_t._M_impl.super__Rb_tree_header._M_header;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars2._M_t._M_impl.super__Rb_tree_header._M_header;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars3._M_t._M_impl.super__Rb_tree_header._M_header;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (__args = m.matrix_.super_RU_pairing_option.barcode_.
                super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var2 = bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
      __args != m.matrix_.super_RU_pairing_option.barcode_.
                super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; __args = __args + 1) {
    __args_2 = &__args->death;
    std::
    _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
    ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
              ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                *)&bars1,&__args->dim,&__args->birth,__args_2);
    std::
    _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
    ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
              ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                *)&bars2,&__args->dim,&__args->birth,__args_2);
    local_620[0] = *__args_2;
    local_628._0_4_ = __args->dim;
    local_628._4_4_ = __args->birth;
    std::
    _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
    ::_M_emplace_unique<int&,unsigned_int&,unsigned_int&>
              ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                *)&bars3,(int *)&local_628,(uint *)((long)&local_628 + 4),local_620);
  }
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x574);
  local_620[0] = local_620[0] & 0xffffff00;
  local_628 = &PTR__lazy_ostream_0020bf58;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = (char **)0x1b33dd;
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_218 = "";
  local_640[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_628,&local_220,0x574,1,2,&p_Var2[1]._M_parent,"std::get<0>(*it)",local_640,"0");
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_230,0x575);
  local_620[0] = local_620[0] & 0xffffff00;
  local_628 = &PTR__lazy_ostream_0020bf58;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = (char **)0x1b33dd;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_248 = "";
  local_640[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_628,&local_250,0x575,1,2,&p_Var2[1].field_0x4,"std::get<1>(*it)",local_640,"0");
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_260,0x577);
  local_620[0] = local_620[0] & 0xffffff00;
  local_628 = &PTR__lazy_ostream_0020bf58;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = (char **)0x1b33dd;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_278 = "";
  local_640[0] = 0xffffffff;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_628,&local_280,0x577,1,2,p_Var2 + 1,"std::get<2>(*it)",local_640,"-1");
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_290,0x579);
  local_620[0] = local_620[0] & 0xffffff00;
  local_628 = &PTR__lazy_ostream_0020bf58;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = (char **)0x1b33dd;
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2a8 = "";
  local_640[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_628,&local_2b0,0x579,1,2,&p_Var5[1]._M_parent,"std::get<0>(*it)",local_640,"0");
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2c0,0x57a);
  local_620[0] = local_620[0] & 0xffffff00;
  local_628 = &PTR__lazy_ostream_0020bf58;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = (char **)0x1b33dd;
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d8 = "";
  local_640[0] = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_628,&local_2e0,0x57a,1,2,&p_Var5[1].field_0x4,"std::get<1>(*it)",local_640,"1");
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f0,0x57b);
  local_620[0] = local_620[0] & 0xffffff00;
  local_628 = &PTR__lazy_ostream_0020bf58;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = (char **)0x1b33dd;
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_308 = "";
  local_640[0] = 3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_628,&local_310,0x57b,1,2,p_Var5 + 1,"std::get<2>(*it)",local_640,"3");
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_320,0x57d);
  local_620[0] = local_620[0] & 0xffffff00;
  local_628 = &PTR__lazy_ostream_0020bf58;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = (char **)0x1b33dd;
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_338 = "";
  local_640[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_628,&local_340,0x57d,1,2,&p_Var5[1]._M_parent,"std::get<0>(*it)",local_640,"0");
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_350,0x57e);
  local_620[0] = local_620[0] & 0xffffff00;
  local_628 = &PTR__lazy_ostream_0020bf58;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = (char **)0x1b33dd;
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_368 = "";
  local_640[0] = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_628,&local_370,0x57e,1,2,&p_Var5[1].field_0x4,"std::get<1>(*it)",local_640,"2");
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_380,0x57f);
  local_620[0] = local_620[0] & 0xffffff00;
  local_628 = &PTR__lazy_ostream_0020bf58;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = (char **)0x1b33dd;
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_398 = "";
  local_640[0] = 4;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_628,&local_3a0,0x57f,1,2,p_Var5 + 1,"std::get<2>(*it)",local_640,"4");
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3b0,0x581);
  local_620[0] = local_620[0] & 0xffffff00;
  local_628 = &PTR__lazy_ostream_0020bf58;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = (char **)0x1b33dd;
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3c8 = "";
  local_640[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_628,&local_3d0,0x581,1,2,&p_Var5[1]._M_parent,"std::get<0>(*it)",local_640,"0");
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3e0,0x582);
  local_620[0] = local_620[0] & 0xffffff00;
  local_628 = &PTR__lazy_ostream_0020bf58;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = (char **)0x1b33dd;
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3f8 = "";
  local_640[0] = 7;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_628,&local_400,0x582,1,2,&p_Var5[1].field_0x4,"std::get<1>(*it)",local_640,"7");
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_410,0x583);
  local_620[0] = local_620[0] & 0xffffff00;
  local_628 = &PTR__lazy_ostream_0020bf58;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = (char **)0x1b33dd;
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_428 = "";
  local_640[0] = 8;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_628,&local_430,0x583,1,2,p_Var5 + 1,"std::get<2>(*it)",local_640,"8");
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_440,0x585);
  local_620[0] = local_620[0] & 0xffffff00;
  local_628 = &PTR__lazy_ostream_0020bf58;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = (char **)0x1b33dd;
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_458 = "";
  local_640[0] = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_628,&local_460,0x585,1,2,&p_Var5[1]._M_parent,"std::get<0>(*it)",local_640,"1");
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_470,0x586);
  local_620[0] = local_620[0] & 0xffffff00;
  local_628 = &PTR__lazy_ostream_0020bf58;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = (char **)0x1b33dd;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_640[0] = 5;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_628,&local_490,0x586,1,2,&p_Var5[1].field_0x4,"std::get<1>(*it)",local_640,"5");
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4a0,0x587);
  local_620[0] = local_620[0] & 0xffffff00;
  local_628 = &PTR__lazy_ostream_0020bf58;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = (char **)0x1b33dd;
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b8 = "";
  local_640[0] = 6;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_628,&local_4c0,0x587,1,2,p_Var5 + 1,"std::get<2>(*it)",local_640,"6");
  puVar6 = (undefined1 *)std::_Rb_tree_increment(p_Var5);
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4d0,0x589);
  local_638 = 0;
  sStack_630.pi_ = (sp_counted_base *)0x0;
  local_608 = "it == bars1.end()";
  local_600 = "";
  local_620[0] = local_620[0] & 0xffffff00;
  local_628 = &PTR__lazy_ostream_0020c158;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4e8 = "";
  local_610 = &local_608;
  local_640[0]._0_1_ = (_Rb_tree_header *)puVar6 == &bars1._M_t._M_impl.super__Rb_tree_header;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_630);
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_500,0x58b);
  local_640[0]._0_1_ = std::operator==(&bars1._M_t,&bars2._M_t);
  local_638 = 0;
  sStack_630.pi_ = (sp_counted_base *)0x0;
  local_608 = "bars1 == bars2";
  local_600 = "";
  local_620[0] = local_620[0] & 0xffffff00;
  local_628 = &PTR__lazy_ostream_0020c158;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_518 = "";
  local_610 = &local_608;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_630);
  local_530 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_528 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_530,0x58c);
  bVar4 = std::operator==(&bars1._M_t,&bars3._M_t);
  local_640[0] = CONCAT31(local_640[0]._1_3_,bVar4);
  local_638 = 0;
  sStack_630.pi_ = (sp_counted_base *)0x0;
  local_608 = "bars1 == bars3";
  local_600 = "";
  local_620[0] = local_620[0] & 0xffffff00;
  local_628 = &PTR__lazy_ostream_0020c158;
  local_618 = &boost::unit_test::lazy_ostream::inst;
  local_610 = &local_608;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_630);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars3._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars2._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars1._M_t);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>
  ::~Matrix(&m);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_barcode() {
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  auto columns = build_longer_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  const auto& barcode = m.get_current_barcode();

  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    columns[5].clear();
  } else {
    columns = build_longer_chain_matrix<typename Matrix::Column>();
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::has_row_access) {
    std::vector<witness_content<typename Matrix::Column> > rows;
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      rows = build_longer_reduced_row_matrix<typename Matrix::Column>();
    } else {
      rows = build_longer_chain_row_matrix<typename Matrix::Column>();
    }
    unsigned int i = 0;
    for (auto& r : rows) {
      if constexpr (Matrix::Option_list::has_removable_rows)
        if (i == 6) continue;
      test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
    }
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  // TODO: verify why this -1 works...: it->death should be unsigned int, so double conversion
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 3);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 4);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 7);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 6);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}